

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O2

int KINSetErrFile(void *kinmem,FILE *errfp)

{
  int iVar1;
  
  if (kinmem == (void *)0x0) {
    iVar1 = -1;
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINSetErrFile","kinsol_mem = NULL illegal.");
  }
  else {
    *(FILE **)((long)kinmem + 0x260) = errfp;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINSetErrFile(void *kinmem, FILE *errfp)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINSetErrFile", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;
  kin_mem->kin_errfp = errfp;

  return(KIN_SUCCESS);
}